

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O1

void __thiscall siamese::EncoderPacketWindow::RemoveElements(EncoderPacketWindow *this)

{
  ostringstream *this_00;
  EncoderSubwindow **ppEVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  bool bVar4;
  uint uVar5;
  int iVar6;
  OutputWorker *this_01;
  uint uVar7;
  uint elementStart;
  uint sumIndex;
  uint uVar8;
  long lVar9;
  EncoderColumnLane *pEVar10;
  uint uVar11;
  uint laneIndex;
  long lVar12;
  uint laneLongest [8];
  undefined1 local_1b8 [392];
  
  uVar7 = this->FirstUnremovedElement;
  if (DAT_0020d7e8 < 3) {
    this_00 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger;
    local_1b8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,DAT_0020d818,DAT_0020d820)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"******** Removing up to ",0x18);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," and startColumn=",0x11);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  uVar11 = uVar7 >> 6;
  uVar7 = uVar7 & 0xffffffc0;
  if (this->SumStartElement < this->SumEndElement) {
    pEVar10 = this->Lanes;
    lVar12 = 0;
    do {
      lVar9 = 0;
      do {
        GetSum(this,(uint)lVar12,(uint)lVar9,uVar7);
        pEVar10->NextElement[lVar9] = pEVar10->NextElement[lVar9] - uVar7;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar12 = lVar12 + 1;
      pEVar10 = pEVar10 + 1;
    } while (lVar12 != 8);
    uVar8 = this->SumStartElement;
    if (uVar8 <= uVar7 && uVar7 - uVar8 != 0) {
      this->SumErasedCount = this->SumErasedCount + (uVar7 - uVar8);
    }
    uVar5 = this->SumEndElement - uVar7;
    if (this->SumEndElement < uVar7) {
      uVar5 = 0;
    }
    this->SumEndElement = uVar5;
    uVar5 = uVar8 - uVar7;
    if (uVar8 < uVar7) {
      uVar5 = 0;
    }
    this->SumStartElement = uVar5;
  }
  bVar4 = pktalloc::LightVector<siamese::EncoderSubwindow_*,_25U>::SetSize_NoCopy
                    (&this->SubwindowsShift,uVar11);
  if (bVar4) {
    memcpy((this->SubwindowsShift).DataPtr,(this->Subwindows).DataPtr,(ulong)(uVar11 * 8));
    uVar8 = (this->Subwindows).Size - uVar11;
    ppEVar1 = (this->Subwindows).DataPtr;
    memmove(ppEVar1,ppEVar1 + uVar11,(ulong)uVar8 * 8);
    memcpy((this->Subwindows).DataPtr + (int)uVar8,(this->SubwindowsShift).DataPtr,
           (ulong)(uVar11 * 8));
    uVar11 = this->Count;
    uVar8 = this->FirstUnremovedElement;
    uVar5 = uVar11 - uVar7;
    this->Count = uVar5;
    elementStart = uVar8 - uVar7;
    this->ColumnStart = uVar7 + this->ColumnStart & 0x3fffff;
    this->FirstUnremovedElement = elementStart;
    local_1b8._0_8_ = (char *)0x0;
    local_1b8._8_4_ = Trace;
    local_1b8._12_4_ = 0;
    local_1b8._16_8_ = 0;
    local_1b8._24_8_ = 0;
    uVar7 = 0;
    if (elementStart < uVar5) {
      ppEVar1 = (this->Subwindows).DataPtr;
      iVar6 = uVar11 - uVar8;
      uVar7 = 0;
      uVar11 = elementStart;
      do {
        uVar8 = (ppEVar1[uVar11 >> 6]->Originals)._M_elems[uVar11 & 0x3f].Buffer.Bytes;
        if (uVar7 <= uVar8) {
          uVar7 = uVar8;
        }
        if (uVar8 < *(uint *)(local_1b8 + (ulong)(uVar11 & 7) * 4)) {
          uVar8 = *(uint *)(local_1b8 + (ulong)(uVar11 & 7) * 4);
        }
        *(uint *)(local_1b8 + (ulong)(uVar11 & 7) * 4) = uVar8;
        uVar11 = uVar11 + 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    this->LongestPacket = uVar7;
    auVar3._8_4_ = local_1b8._8_4_;
    auVar3._0_8_ = local_1b8._0_8_;
    auVar3._12_4_ = local_1b8._12_4_;
    auVar3._16_8_ = local_1b8._16_8_;
    auVar3._24_8_ = local_1b8._24_8_;
    auVar2 = vpmovsxwd_avx2(_DAT_001b7b80);
    vpscatterdd_avx512vl(ZEXT832(this) + ZEXT832(0x158) + auVar2,0xffff,auVar3);
    if (this->SumEndElement <= this->SumStartElement) {
      ResetSums(this,elementStart);
    }
  }
  else {
    this->EmergencyDisabled = true;
  }
  return;
}

Assistant:

void EncoderPacketWindow::RemoveElements()
{
    const unsigned firstKeptSubwindow  = FirstUnremovedElement / kSubwindowSize;
    const unsigned removedElementCount = firstKeptSubwindow * kSubwindowSize;
    SIAMESE_DEBUG_ASSERT(firstKeptSubwindow >= 1);
    SIAMESE_DEBUG_ASSERT(firstKeptSubwindow < Subwindows.GetSize());
    SIAMESE_DEBUG_ASSERT(removedElementCount % kColumnLaneCount == 0);
    SIAMESE_DEBUG_ASSERT(removedElementCount <= FirstUnremovedElement);

    Logger.Info("******** Removing up to ", FirstUnremovedElement, " and startColumn=", ColumnStart);

    // If there are running sums:
    if (SumEndElement > SumStartElement)
    {
        // Roll up the sums past the removal point
        for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex)
        {
            for (unsigned sumIndex = 0; sumIndex < kColumnSumCount; ++sumIndex)
            {
                GetSum(laneIndex, sumIndex, removedElementCount);

                SIAMESE_DEBUG_ASSERT(Lanes[laneIndex].NextElement[sumIndex] >= removedElementCount);
                Lanes[laneIndex].NextElement[sumIndex] -= removedElementCount;
            }
        }

        if (removedElementCount > SumStartElement) {
            SumErasedCount += removedElementCount - SumStartElement;
        }

        if (SumEndElement > removedElementCount) {
            SumEndElement -= removedElementCount;
        }
        else {
            SumEndElement = 0;
        }

        if (SumStartElement > removedElementCount) {
            SumStartElement -= removedElementCount;
        }
        else {
            SumStartElement = 0;
        }
    }

    // Shift kept subwindows to the front of the vector:

    // Resize a temporary buffer for removed subwindows
    if (!SubwindowsShift.SetSize_NoCopy(firstKeptSubwindow))
    {
        SIAMESE_DEBUG_BREAK(); // OOM
        EmergencyDisabled = true;
        return;
    }

    // Store removed subwindows temporarily
    memcpy(
        SubwindowsShift.GetPtr(0),
        Subwindows.GetPtr(0),
        firstKeptSubwindow * sizeof(EncoderSubwindow*)
    );

    const unsigned subwindowsShifted = Subwindows.GetSize() - firstKeptSubwindow;

    // Shift subwindows to front that are being kept
    memmove(
        Subwindows.GetPtr(0),
        Subwindows.GetPtr(firstKeptSubwindow),
        subwindowsShifted * sizeof(EncoderSubwindow*)
    );

    // Removed subwindows are moved to the end (unordered) for later reuse
    memcpy(
        Subwindows.GetPtr(subwindowsShifted),
        SubwindowsShift.GetPtr(0),
        firstKeptSubwindow * sizeof(EncoderSubwindow*)
    );

    // Update the count of elements in the window
    SIAMESE_DEBUG_ASSERT(Count >= removedElementCount);
    Count -= removedElementCount;

    // Roll up the ColumnStart member
    ColumnStart = ElementToColumn(removedElementCount);
    SIAMESE_DEBUG_ASSERT(ColumnStart == Subwindows.GetRef(0)->Originals[0].Column);

    // Roll up the FirstUnremovedElement member
    SIAMESE_DEBUG_ASSERT(FirstUnremovedElement % kSubwindowSize == FirstUnremovedElement - removedElementCount);
    SIAMESE_DEBUG_ASSERT(FirstUnremovedElement >= removedElementCount);
    FirstUnremovedElement -= removedElementCount;

    // Determine the new longest packets
    unsigned longestPacket = 0;
    unsigned laneLongest[kColumnLaneCount] = { 0 };
    for (unsigned i = FirstUnremovedElement, count = Count; i < count; ++i)
    {
        OriginalPacket* original     = GetWindowElement(i);
        const unsigned originalBytes = original->Buffer.Bytes;
        if (longestPacket < originalBytes) {
            longestPacket = originalBytes;
        }
        SIAMESE_DEBUG_ASSERT(original->Column % kColumnLaneCount == i % kColumnLaneCount);
        const unsigned laneIndex = i % kColumnLaneCount;
        if (laneLongest[laneIndex] < originalBytes) {
            laneLongest[laneIndex] = originalBytes;
        }
    }

    // Update longest packet fields
    LongestPacket = longestPacket;
    for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex) {
        Lanes[laneIndex].LongestPacket = laneLongest[laneIndex];
    }

    // If there are no running sums:
    if (SumEndElement <= SumStartElement) {
        ResetSums(FirstUnremovedElement);
    }
}